

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder.c
# Opt level: O2

void length(lzma_range_encoder *rc,lzma_length_encoder *lc,uint32_t pos_state,uint32_t len,
           _Bool fast_mode)

{
  uint32_t *puVar1;
  size_t sVar2;
  uint symbol;
  uint32_t bit_count;
  probability (*papVar3) [8];
  
  if (0x111 < len) {
    __assert_fail("len <= MATCH_LEN_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder.c"
                  ,0x6e,
                  "void length(lzma_range_encoder *, lzma_length_encoder *, const uint32_t, uint32_t, const _Bool)"
                 );
  }
  symbol = len - 2;
  sVar2 = rc->count;
  if (symbol < 8) {
    rc->symbols[sVar2] = RC_BIT_0;
    rc->probs[sVar2] = &lc->choice;
    rc->count = sVar2 + 1;
    papVar3 = lc->low;
  }
  else {
    rc->symbols[sVar2] = RC_BIT_1;
    rc->probs[sVar2] = &lc->choice;
    symbol = len - 10;
    if (7 < symbol) {
      rc->symbols[sVar2 + 1] = RC_BIT_1;
      rc->probs[sVar2 + 1] = &lc->choice2;
      rc->count = sVar2 + 2;
      symbol = len - 0x12;
      papVar3 = (probability (*) [8])lc->high;
      bit_count = 8;
      goto LAB_0019a464;
    }
    rc->symbols[sVar2 + 1] = RC_BIT_0;
    rc->probs[sVar2 + 1] = &lc->choice2;
    rc->count = sVar2 + 2;
    papVar3 = lc->mid;
  }
  papVar3 = papVar3 + pos_state;
  bit_count = 3;
LAB_0019a464:
  rc_bittree(rc,*papVar3,bit_count,symbol);
  if (!fast_mode) {
    puVar1 = lc->counters + pos_state;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      length_update_prices(lc,pos_state);
      return;
    }
  }
  return;
}

Assistant:

static inline void
length(lzma_range_encoder *rc, lzma_length_encoder *lc,
		const uint32_t pos_state, uint32_t len, const bool fast_mode)
{
	assert(len <= MATCH_LEN_MAX);
	len -= MATCH_LEN_MIN;

	if (len < LEN_LOW_SYMBOLS) {
		rc_bit(rc, &lc->choice, 0);
		rc_bittree(rc, lc->low[pos_state], LEN_LOW_BITS, len);
	} else {
		rc_bit(rc, &lc->choice, 1);
		len -= LEN_LOW_SYMBOLS;

		if (len < LEN_MID_SYMBOLS) {
			rc_bit(rc, &lc->choice2, 0);
			rc_bittree(rc, lc->mid[pos_state], LEN_MID_BITS, len);
		} else {
			rc_bit(rc, &lc->choice2, 1);
			len -= LEN_MID_SYMBOLS;
			rc_bittree(rc, lc->high, LEN_HIGH_BITS, len);
		}
	}

	// Only getoptimum uses the prices so don't update the table when
	// in fast mode.
	if (!fast_mode)
		if (--lc->counters[pos_state] == 0)
			length_update_prices(lc, pos_state);
}